

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBinFromMemory::load(ModelBinFromMemory *this,int w,int type)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  size_t sVar5;
  float *pfVar6;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  Mat *in_RDI;
  int i;
  float *ptr;
  uchar *index_array;
  float *quantization_value;
  uint flag;
  anon_union_4_2_77b30072 flag_struct;
  Mat *m;
  int in_stack_ffffffffffffff6c;
  Mat *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffa4;
  int iVar7;
  unsigned_short *in_stack_ffffffffffffffa8;
  char local_1c;
  
  if (**(long **)(in_RSI + 8) == 0) {
    Mat::Mat(in_RDI);
  }
  else if (in_ECX == 0) {
    uVar1 = *(uint *)**(undefined8 **)(in_RSI + 8);
    **(long **)(in_RSI + 8) = **(long **)(in_RSI + 8) + 4;
    local_1c = (char)uVar1;
    if (uVar1 == 0x1306b47) {
      Mat::from_float16(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      sVar5 = ncnn::alignSize((long)in_EDX * 2,4);
      **(long **)(in_RSI + 8) = sVar5 + **(long **)(in_RSI + 8);
    }
    else if ((uVar1 & 0xff) + (uVar1 >> 8 & 0xff) + (uVar1 >> 0x10 & 0xff) + (uVar1 >> 0x18) == 0) {
      if (local_1c == '\0') {
        Mat::Mat(in_RDI,in_EDX,(void *)**(undefined8 **)(in_RSI + 8),4);
        **(long **)(in_RSI + 8) = (long)in_EDX * 4 + **(long **)(in_RSI + 8);
      }
      else {
        Mat::Mat(in_RDI);
      }
    }
    else {
      lVar2 = **(long **)(in_RSI + 8);
      **(long **)(in_RSI + 8) = **(long **)(in_RSI + 8) + 0x400;
      lVar3 = **(long **)(in_RSI + 8);
      sVar5 = ncnn::alignSize((long)in_EDX,4);
      **(long **)(in_RSI + 8) = **(long **)(in_RSI + 8) + sVar5;
      Mat::Mat(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,0x151359);
      bVar4 = Mat::empty(in_stack_ffffffffffffff70);
      if (!bVar4) {
        pfVar6 = Mat::operator_cast_to_float_(in_RDI);
        for (iVar7 = 0; iVar7 < in_EDX; iVar7 = iVar7 + 1) {
          pfVar6[iVar7] = *(float *)(lVar2 + (ulong)*(byte *)(lVar3 + iVar7) * 4);
        }
      }
    }
  }
  else if (in_ECX == 1) {
    Mat::Mat(in_RDI,in_EDX,(void *)**(undefined8 **)(in_RSI + 8),4);
    **(long **)(in_RSI + 8) = (long)in_EDX * 4 + **(long **)(in_RSI + 8);
  }
  else {
    fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)in_ECX);
    Mat::Mat(in_RDI);
  }
  return in_RDI;
}

Assistant:

Mat ModelBinFromMemory::load(int w, int type) const
{
    if (!mem)
        return Mat();

    if (type == 0)
    {
        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        memcpy(&flag_struct, mem, sizeof(flag_struct));
        mem += sizeof(flag_struct);

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            Mat m = Mat::from_float16((unsigned short*)mem, w);
            mem += alignSize(w * sizeof(unsigned short), 4);
            return m;
        }

        if (flag != 0)
        {
            // quantized data
            const float* quantization_value = (const float*)mem;
            mem += 256 * sizeof(float);

            const unsigned char* index_array = (const unsigned char*)mem;
            mem += alignSize(w * sizeof(unsigned char), 4);

            Mat m(w);
            if (m.empty())
                return m;

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }

            return m;
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            Mat m = Mat(w, (float*)mem);
            mem += w * sizeof(float);
            return m;
        }
    }
    else if (type == 1)
    {
        // raw data
        Mat m = Mat(w, (float*)mem);
        mem += w * sizeof(float);
        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}